

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

bool spvParseTargetEnv(char *s,spv_target_env_conflict *env)

{
  bool bVar1;
  pair<const_char_*,_spv_target_env> *name_env;
  pair<const_char_*,_spv_target_env> *__end1;
  pair<const_char_*,_spv_target_env> *__begin1;
  pair<const_char_*,_spv_target_env> (*__range1) [26];
  anon_class_8_1_54a39813 match;
  spv_target_env_conflict *env_local;
  char *s_local;
  
  __end1 = spvTargetEnvNameMap;
  __range1 = (pair<const_char_*,_spv_target_env> (*) [26])s;
  match.s = (char *)env;
  while( true ) {
    if (__end1 == (pair<const_char_*,_spv_target_env> *)&spvc_parsed_ir_s::vtable) {
      if (match.s != (char *)0x0) {
        match.s[0] = '\0';
        match.s[1] = '\0';
        match.s[2] = '\0';
        match.s[3] = '\0';
      }
      return false;
    }
    bVar1 = spvParseTargetEnv::anon_class_8_1_54a39813::operator()
                      ((anon_class_8_1_54a39813 *)&__range1,__end1->first);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  if (match.s != (char *)0x0) {
    *(anon_enum_32 *)match.s = __end1->second;
  }
  return true;
}

Assistant:

bool spvParseTargetEnv(const char* s, spv_target_env* env) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  for (auto& name_env : spvTargetEnvNameMap) {
    if (match(name_env.first)) {
      if (env) {
        *env = name_env.second;
      }
      return true;
    }
  }
  if (env) *env = SPV_ENV_UNIVERSAL_1_0;
  return false;
}